

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

Float pbrt::AngleBetween(Quaternion *q1,Quaternion *q2)

{
  undefined1 auVar1 [16];
  Float FVar2;
  ulong extraout_XMM0_Qb;
  undefined1 auVar6 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar9 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  Quaternion QVar10;
  Quaternion *in_stack_ffffffffffffffc8;
  Quaternion *in_stack_ffffffffffffffd0;
  Quaternion *in_stack_ffffffffffffffd8;
  Quaternion *in_stack_ffffffffffffffe0;
  undefined4 local_4;
  undefined1 extraout_var [60];
  
  FVar2 = Dot(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  auVar9 = ZEXT856(extraout_XMM0_Qb);
  auVar6 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  if (0.0 <= FVar2) {
    QVar10 = Quaternion::operator-(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    auVar8._0_8_ = QVar10._8_8_;
    auVar8._8_56_ = auVar9;
    auVar5._0_8_ = QVar10.v.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar5._8_56_ = auVar6;
    vmovlpd_avx(auVar5._0_16_);
    vmovlpd_avx(auVar8._0_16_);
    Length((Quaternion *)0x637724);
    local_4 = SafeASin(0.0);
    local_4 = local_4 * 2.0;
  }
  else {
    QVar10 = Quaternion::operator+(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    auVar7._0_8_ = QVar10._8_8_;
    auVar7._8_56_ = auVar9;
    auVar3._0_8_ = QVar10.v.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar3._8_56_ = auVar6;
    vmovlpd_avx(auVar3._0_16_);
    vmovlpd_avx(auVar7._0_16_);
    Length((Quaternion *)0x6376d0);
    auVar4._0_4_ = SafeASin(0.0);
    auVar4._4_60_ = extraout_var;
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar4._0_16_,
                             SUB6416(ZEXT464(0x40490fdb),0));
    local_4 = auVar1._0_4_;
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU
inline Float AngleBetween(const Quaternion &q1, const Quaternion &q2) {
    if (Dot(q1, q2) < 0)
        return Pi - 2 * SafeASin(Length(q1 + q2) / 2);
    else
        return 2 * SafeASin(Length(q2 - q1) / 2);
}